

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O0

int SUNLinSolSpace_SPTFQMR(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  sunindextype local_30;
  sunindextype lrw1;
  sunindextype liw1;
  long *leniwLS_local;
  long *lenrwLS_local;
  SUNLinearSolver S_local;
  
  liw1 = (sunindextype)leniwLS;
  leniwLS_local = lenrwLS;
  if (*(long *)(*(long *)(*(long *)((long)S->content + 0x90) + 8) + 0x20) == 0) {
    lrw1 = 0;
    local_30 = 0;
  }
  else {
    lenrwLS_local = (long *)S;
    N_VSpace(*(N_Vector *)((long)S->content + 0x90),&local_30,&lrw1);
  }
  *leniwLS_local = local_30 * 0xb;
  *(sunindextype *)liw1 = lrw1 * 0xb;
  return 0;
}

Assistant:

int SUNLinSolSpace_SPTFQMR(SUNLinearSolver S, 
                           long int *lenrwLS, 
                           long int *leniwLS)
{
  sunindextype liw1, lrw1;
  if (SPTFQMR_CONTENT(S)->vtemp1->ops->nvspace)
    N_VSpace(SPTFQMR_CONTENT(S)->vtemp1, &lrw1, &liw1);
  else
    lrw1 = liw1 = 0;
  *lenrwLS = lrw1*11;
  *leniwLS = liw1*11;
  return(SUNLS_SUCCESS);
}